

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O2

LogicalIndex __thiscall duckdb::UniqueConstraint::GetIndex(UniqueConstraint *this)

{
  idx_t iVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  iVar1 = (this->index).index;
  if (iVar1 != 0xffffffffffffffff) {
    return (LogicalIndex)iVar1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "UniqueConstraint::GetIndex called on a unique constraint without an index",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool UniqueConstraint::HasIndex() const {
	return index.index != DConstants::INVALID_INDEX;
}